

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall cppcms::application::attach(application *this,application *app)

{
  pointer *pppaVar1;
  _data *p_Var2;
  iterator __position;
  application *paVar3;
  application *paVar4;
  application *local_18;
  
  p_Var2 = (this->d).ptr_;
  __position._M_current =
       (p_Var2->managed_children).
       super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (p_Var2->managed_children).
      super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_18 = app;
    std::vector<cppcms::application*,std::allocator<cppcms::application*>>::
    _M_realloc_insert<cppcms::application*const&>
              ((vector<cppcms::application*,std::allocator<cppcms::application*>> *)
               &p_Var2->managed_children,__position,&local_18);
    app = local_18;
  }
  else {
    *__position._M_current = app;
    pppaVar1 = &(p_Var2->managed_children).
                super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  if (app->parent_ != this) {
    app->parent_ = this;
    paVar4 = this->root_;
    paVar3 = paVar4->root_;
    if (paVar4 != paVar4->root_) {
      do {
        paVar4 = paVar3;
        this->root_ = paVar4;
        paVar3 = paVar4->root_;
      } while (paVar4->root_ != paVar4);
    }
    app->root_ = paVar4;
  }
  return;
}

Assistant:

void application::attach(application *app)
{
	d->managed_children.push_back(app);
	add(*app);
}